

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

int testing::internal::
    CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
              (vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *c,
              _func_bool_TestInfo_ptr *predicate)

{
  bool bVar1;
  reference ppTVar2;
  ulong uVar3;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  *in_RSI;
  const_iterator it;
  int count;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  local_20;
  int local_14;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_20._M_current =
       (TestInfo **)
       std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
              (in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 = local_10;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
              ::operator*(&local_20);
    uVar3 = (*(code *)in_stack_ffffffffffffffd0)(*ppTVar2);
    if ((uVar3 & 1) != 0) {
      local_14 = local_14 + 1;
    }
    __gnu_cxx::
    __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
    ::operator++(&local_20);
  }
  return local_14;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (typename Container::const_iterator it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it))
      ++count;
  }
  return count;
}